

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O1

void TR_CompSt(ast *node)

{
  ast *paVar1;
  
  paVar1 = child(node,2);
  TR_DefList(paVar1);
  paVar1 = child(node,3);
  TR_StmtList(paVar1);
  return;
}

Assistant:

static void TR_CompSt(ast *node) {
    TR_DefList(child(node, 2));
    TR_StmtList(child(node, 3));
}